

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_assertion.hpp
# Opt level: O0

AssertionResult * __thiscall
iuutil::
CmpHelperEqIterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int_const*>
          (AssertionResult *__return_storage_ptr__,iuutil *this,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> b1,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> e1,int *b2,int *e2
          )

{
  bool bVar1;
  reference val1;
  internal *this_00;
  reference value;
  iuStreamMessage *piVar2;
  AssertionResult *rhs;
  AssertionResult local_290;
  int local_268;
  int local_264;
  int elem2;
  int elem1;
  string local_240;
  AssertionResult local_210;
  AssertionResult local_1e8;
  undefined1 local_1c0 [8];
  Message ar;
  bool result;
  int elem;
  int *e2_local;
  int *b2_local;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> e1_local;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> b1_local;
  
  ar.m_stream.super_iu_stringstream._388_4_ = 0;
  ar.m_stream.super_iu_stringstream._387_1_ = 1;
  b2_local = b1._M_current;
  e1_local._M_current = (int *)this;
  iutest::detail::iuStreamMessage::iuStreamMessage((iuStreamMessage *)local_1c0);
  ar.m_stream.super_iu_stringstream._388_4_ = 0;
  for (e2_local = e1._M_current;
      bVar1 = __gnu_cxx::operator!=
                        (&e1_local,
                         (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         &b2_local), bVar1 && e2_local != b2; e2_local = e2_local + 1) {
    val1 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
           operator*(&e1_local);
    iutest::internal::backward::EqHelper<false>::Compare<int>(&local_210,"","",val1,e2_local);
    iutest::AssertionResult::operator!(&local_1e8,&local_210);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool(&local_1e8);
    iutest::AssertionResult::~AssertionResult(&local_1e8);
    iutest::AssertionResult::~AssertionResult(&local_210);
    if (bVar1) {
      ar.m_stream.super_iu_stringstream._387_1_ = 0;
      piVar2 = iutest::detail::iuStreamMessage::operator<<
                         ((iuStreamMessage *)local_1c0,(char (*) [25])"\nMismatch in a position ");
      piVar2 = iutest::detail::iuStreamMessage::operator<<
                         (piVar2,(int *)&ar.m_stream.super_iu_stringstream.field_0x184);
      piVar2 = iutest::detail::iuStreamMessage::operator<<(piVar2,(char (*) [3])0x20209d);
      this_00 = (internal *)
                __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&e1_local);
      iutest::internal::FormatForComparisonFailureMessage<int,int>(&local_240,this_00,e2_local,val1)
      ;
      piVar2 = iutest::detail::iuStreamMessage::operator<<(piVar2,&local_240);
      piVar2 = iutest::detail::iuStreamMessage::operator<<(piVar2,(char (*) [5])" vs ");
      value = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator*(&e1_local);
      iutest::internal::FormatForComparisonFailureMessage<int,int>
                ((string *)&elem2,(internal *)e2_local,value,val1);
      iutest::detail::iuStreamMessage::operator<<
                (piVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&elem2)
      ;
      std::__cxx11::string::~string((string *)&elem2);
      std::__cxx11::string::~string((string *)&local_240);
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&e1_local);
    ar.m_stream.super_iu_stringstream._388_4_ = ar.m_stream.super_iu_stringstream._388_4_ + 1;
  }
  bVar1 = __gnu_cxx::operator!=
                    (&e1_local,
                     (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     &b2_local);
  if (bVar1) {
    local_264 = ar.m_stream.super_iu_stringstream._388_4_;
    while (bVar1 = __gnu_cxx::operator!=
                             (&e1_local,
                              (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)&b2_local), bVar1) {
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&e1_local);
      local_264 = local_264 + 1;
    }
    ar.m_stream.super_iu_stringstream._387_1_ = 0;
    piVar2 = iutest::detail::iuStreamMessage::operator<<
                       ((iuStreamMessage *)local_1c0,(char (*) [21])"\nMismatch element : ");
    piVar2 = iutest::detail::iuStreamMessage::operator<<(piVar2,&local_264);
    piVar2 = iutest::detail::iuStreamMessage::operator<<(piVar2,(char (*) [5])" vs ");
    iutest::detail::iuStreamMessage::operator<<
              (piVar2,(int *)&ar.m_stream.super_iu_stringstream.field_0x184);
  }
  if (e2_local != b2) {
    local_268 = ar.m_stream.super_iu_stringstream._388_4_;
    for (; e2_local != b2; e2_local = e2_local + 1) {
      local_268 = local_268 + 1;
    }
    ar.m_stream.super_iu_stringstream._387_1_ = 0;
    piVar2 = iutest::detail::iuStreamMessage::operator<<
                       ((iuStreamMessage *)local_1c0,(char (*) [21])"\nMismatch element : ");
    piVar2 = iutest::detail::iuStreamMessage::operator<<
                       (piVar2,(int *)&ar.m_stream.super_iu_stringstream.field_0x184);
    piVar2 = iutest::detail::iuStreamMessage::operator<<(piVar2,(char (*) [5])" vs ");
    iutest::detail::iuStreamMessage::operator<<(piVar2,&local_268);
  }
  if ((ar.m_stream.super_iu_stringstream._387_1_ & 1) == 0) {
    iutest::AssertionFailure();
    rhs = iutest::AssertionResult::operator<<(&local_290,(iuStreamMessage *)local_1c0);
    iutest::AssertionResult::AssertionResult(__return_storage_ptr__,rhs);
    iutest::AssertionResult::~AssertionResult(&local_290);
  }
  else {
    iutest::AssertionSuccess();
  }
  iutest::detail::iuStreamMessage::~iuStreamMessage((iuStreamMessage *)local_1c0);
  return __return_storage_ptr__;
}

Assistant:

::iutest::AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperEqIterator(T1 b1, T1 e1, T2 b2, T2 e2)
{
    int elem=0;
    bool result = true;
    ::iutest::Message ar;
    for(elem=0; b1 != e1 && b2 != e2; ++b1, ++b2, ++elem)
    {
        if(!::iutest::internal::backward::EqHelper<false>::Compare("", "", *b1, *b2))
        {
            result = false;
            ar << "\nMismatch in a position " << elem << ": "
                << ::iutest::internal::FormatForComparisonFailureMessage(*b1, *b2)
                << " vs " << ::iutest::internal::FormatForComparisonFailureMessage(*b2, *b1);
        }
    }
    if(b1 != e1)
    {
        int elem1 = elem;
        for(; b1 != e1; ++b1, ++elem1) {}
        result = false;
        ar << "\nMismatch element : " << elem1 << " vs " << elem;
    }
    if(b2 != e2)
    {
        int elem2 = elem;
        for(; b2 != e2; ++b2, ++elem2) {}
        result = false;
        ar << "\nMismatch element : " << elem << " vs " << elem2;
    }
    if( !result )
    {
        return ::iutest::AssertionFailure() << ar;
    }
    return ::iutest::AssertionSuccess();
}